

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O2

bool __thiscall
crnlib::task_pool::queue_task(task_pool *this,task_callback_func pFunc,uint64 data,void *pData_ptr)

{
  bool bVar1;
  task local_30;
  
  local_30.m_flags = 0;
  LOCK();
  this->m_total_submitted_tasks = this->m_total_submitted_tasks + 1;
  UNLOCK();
  local_30.m_data = data;
  local_30.m_pData_ptr = pData_ptr;
  local_30.field_2.m_callback = pFunc;
  bVar1 = tsstack<crnlib::task_pool::task,_16U>::try_push(&this->m_task_stack,&local_30);
  if (bVar1) {
    semaphore::release(&this->m_tasks_available,1);
  }
  else {
    LOCK();
    this->m_total_completed_tasks = this->m_total_completed_tasks + 1;
    UNLOCK();
  }
  return bVar1;
}

Assistant:

bool task_pool::queue_task(task_callback_func pFunc, uint64 data, void* pData_ptr) {
  CRNLIB_ASSERT(pFunc);

  task tsk;
  tsk.m_callback = pFunc;
  tsk.m_data = data;
  tsk.m_pData_ptr = pData_ptr;
  tsk.m_flags = 0;

  atomic_increment32(&m_total_submitted_tasks);
  if (!m_task_stack.try_push(tsk)) {
    atomic_increment32(&m_total_completed_tasks);
    return false;
  }

  m_tasks_available.release(1);

  return true;
}